

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_done_sending(Curl_easy *data,SingleRequest *k)

{
  connectdata *conn;
  CURLcode CVar1;
  
  conn = data->conn;
  k->keepon = k->keepon & 0xfffffffd;
  Curl_http2_done_sending(data,conn);
  if ((((conn->bits).field_0x6 & 2) != 0) && (CVar1 = Curl_readrewind(data), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_done_sending(struct Curl_easy *data,
                           struct SingleRequest *k)
{
  struct connectdata *conn = data->conn;
  k->keepon &= ~KEEP_SEND; /* we're done writing */

  /* These functions should be moved into the handler struct! */
  Curl_http2_done_sending(data, conn);
  Curl_quic_done_sending(data);

  if(conn->bits.rewindaftersend) {
    CURLcode result = Curl_readrewind(data);
    if(result)
      return result;
  }
  return CURLE_OK;
}